

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

int __thiscall QMetaObject::indexOfProperty(QMetaObject *this,char *name)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint *puVar6;
  QMetaObject *this_00;
  
  this_00 = this;
  do {
    if (this_00 == (QMetaObject *)0x0) {
      if (((this->d).data[0xc] & 1) == 0) {
        return -1;
      }
      iVar4 = (**(code **)((long)this[-1].d.extradata + 0x28))(&this[-1].d.extradata,name,0);
      return iVar4;
    }
    puVar1 = (this_00->d).data;
    uVar3 = puVar1[6];
    if ((int)puVar1[6] < 1) {
      uVar3 = 0;
    }
    puVar6 = puVar1;
    for (lVar5 = 0; -lVar5 != (ulong)uVar3; lVar5 = lVar5 + -1) {
      puVar2 = (this_00->d).stringdata;
      iVar4 = strcmp(name,(char *)((ulong)puVar2[(long)(int)puVar6[(int)puVar1[7]] * 2] +
                                  (long)puVar2));
      if (iVar4 == 0) {
        iVar4 = propertyOffset(this_00);
        return iVar4 - (int)lVar5;
      }
      puVar6 = puVar6 + 5;
    }
    this_00 = (this_00->d).superdata.direct;
  } while( true );
}

Assistant:

int QMetaObject::indexOfProperty(const char *name) const
{
    const QMetaObject *m = this;
    while (m) {
        const QMetaObjectPrivate *d = priv(m->d.data);
        for (int i = 0; i < d->propertyCount; ++i) {
            const QMetaProperty::Data data = QMetaProperty::getMetaPropertyData(m, i);
            const char *prop = rawStringData(m, data.name());
            if (strcmp(name, prop) == 0) {
                i += m->propertyOffset();
                return i;
            }
        }
        m = m->d.superdata;
    }

    if (priv(this->d.data)->flags & DynamicMetaObject) {
        QAbstractDynamicMetaObject *me =
            const_cast<QAbstractDynamicMetaObject *>(static_cast<const QAbstractDynamicMetaObject *>(this));

        return me->createProperty(name, nullptr);
    }

    return -1;
}